

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

string * __thiscall
rcg::loadFile_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          char *name,bool exception)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  invalid_argument *this_00;
  int iVar5;
  long lVar6;
  long lVar7;
  allocator local_89;
  FileProtocolAdapter rf;
  vector<char,_std::allocator<char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GenApi_3_4::FileProtocolAdapter::FileProtocolAdapter(&rf);
  GenApi_3_4::FileProtocolAdapter::attach((INodeMap *)&rf);
  cVar1 = GenApi_3_4::FileProtocolAdapter::openFile((char *)&rf,(_Ios_Openmode)nodemap);
  if (cVar1 == '\0') {
    if ((char)name != '\0') {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_50,"Cannot open file for reading: ",&local_89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                     &local_50,(char *)nodemap);
      std::invalid_argument::invalid_argument(this_00,(string *)&buffer);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else {
    uVar3 = getInteger((shared_ptr<GenApi_3_4::CNodeMapRef> *)this,"FileSize",(int64_t *)0x0,
                       (int64_t *)0x0,true,false);
    lVar7 = 0x200;
    std::vector<char,_std::allocator<char>_>::vector(&buffer,0x200,(allocator_type *)&local_50);
    lVar6 = 0;
    while ((lVar7 != 0 && (iVar5 = (int)uVar3, 0 < iVar5))) {
      iVar2 = (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if (iVar5 < iVar2) {
        iVar2 = iVar5;
      }
      lVar7 = GenApi_3_4::FileProtocolAdapter::read
                        ((char *)&rf,
                         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,lVar6,(char *)(long)iVar2);
      if (lVar7 == 0) {
        pcVar4 = (char *)getInteger((shared_ptr<GenApi_3_4::CNodeMapRef> *)this,
                                    "FileOperationResult",(int64_t *)0x0,(int64_t *)0x0,false,false)
        ;
        if (pcVar4 != (char *)0x0) {
          lVar7 = GenApi_3_4::FileProtocolAdapter::read
                            ((char *)&rf,
                             (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start,lVar6,pcVar4);
          if (lVar7 != 0) goto LAB_00118a9a;
        }
        lVar7 = 0;
      }
      else {
LAB_00118a9a:
        std::__cxx11::string::append
                  ((char *)__return_storage_ptr__,
                   (ulong)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      }
      lVar6 = lVar6 + lVar7;
      uVar3 = (ulong)(uint)(iVar5 - (int)lVar7);
    }
    GenApi_3_4::FileProtocolAdapter::closeFile((char *)&rf);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  GenApi_3_4::FileProtocolAdapter::~FileProtocolAdapter(&rf);
  return __return_storage_ptr__;
}

Assistant:

std::string loadFile(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                     bool exception)
{
  std::string ret;

  // load file in pieces of 512 bytes

  GenApi::FileProtocolAdapter rf;
  rf.attach(nodemap->_Ptr);

  if (rf.openFile(name, std::ios::in))
  {
    int length=std::numeric_limits<int>::max();
    try
    {
      // limit read operation to file size, if available
      length=rcg::getInteger(nodemap, "FileSize", 0, 0, true);
    }
    catch (const std::exception &)
    { }

    size_t off=0, n=512;
    std::vector<char> buffer(512);

    while (n > 0 && length > 0)
    {
      n=rf.read(buffer.data(), off, std::min(length, static_cast<int>(buffer.size())), name);

      if (n == 0)
      {
        // workaround for reading last partial block if camera reports failure

        n=rcg::getInteger(nodemap, "FileOperationResult");

        if (n > 0)
        {
          n=rf.read(buffer.data(), off, n, name);
        }
      }

      if (n > 0)
      {
        ret.append(buffer.data(), n);
      }

      off+=n;
      length-=n;
    }

    rf.closeFile(name);
  }
  else
  {
    if (exception)
    {
      throw std::invalid_argument(std::string("Cannot open file for reading: ")+name);
    }
  }

  return ret;
}